

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

uint64_t BitsEntropyRefine(VP8LBitEntropy *entropy)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = entropy->nonzeros;
  lVar4 = 0x273;
  if (iVar1 < 5) {
    if (iVar1 < 2) {
      return 0;
    }
    if (iVar1 == 3) {
      lVar4 = 0x3b6;
    }
    else {
      if (iVar1 == 2) {
        lVar6 = (ulong)entropy->sum * 0x31800000;
        uVar2 = entropy->entropy;
        lVar4 = lVar6 + uVar2 + 0x32;
        if ((long)(lVar6 + uVar2) < 0) {
          lVar4 = lVar6 + uVar2 + -0x32;
        }
        return lVar4 / 100;
      }
      lVar4 = 700;
    }
  }
  lVar6 = (ulong)(entropy->sum * 2 - entropy->max_val) * lVar4 * 0x800000;
  uVar3 = entropy->entropy;
  lVar7 = (1000 - lVar4) * uVar3;
  lVar4 = lVar6 + lVar7 + 500;
  if (lVar6 + lVar7 < 0) {
    lVar4 = lVar6 + lVar7 + -500;
  }
  uVar5 = lVar4 / 1000;
  if ((ulong)(lVar4 / 1000) < uVar3) {
    uVar5 = uVar3;
  }
  return uVar5;
}

Assistant:

static WEBP_INLINE uint64_t BitsEntropyRefine(const VP8LBitEntropy* entropy) {
  uint64_t mix;
  if (entropy->nonzeros < 5) {
    if (entropy->nonzeros <= 1) {
      return 0;
    }
    // Two symbols, they will be 0 and 1 in a Huffman code.
    // Let's mix in a bit of entropy to favor good clustering when
    // distributions of these are combined.
    if (entropy->nonzeros == 2) {
      return DivRound(99 * ((uint64_t)entropy->sum << LOG_2_PRECISION_BITS) +
                          entropy->entropy,
                      100);
    }
    // No matter what the entropy says, we cannot be better than min_limit
    // with Huffman coding. I am mixing a bit of entropy into the
    // min_limit since it produces much better (~0.5 %) compression results
    // perhaps because of better entropy clustering.
    if (entropy->nonzeros == 3) {
      mix = 950;
    } else {
      mix = 700;  // nonzeros == 4.
    }
  } else {
    mix = 627;
  }

  {
    uint64_t min_limit = (uint64_t)(2 * entropy->sum - entropy->max_val)
                         << LOG_2_PRECISION_BITS;
    min_limit =
        DivRound(mix * min_limit + (1000 - mix) * entropy->entropy, 1000);
    return (entropy->entropy < min_limit) ? min_limit : entropy->entropy;
  }
}